

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

bool __thiscall Matrix<int>::operator!=(Matrix<int> *this,Matrix<int> *op2)

{
  int local_28;
  int local_24;
  int j;
  int i;
  Matrix<int> *op2_local;
  Matrix<int> *this_local;
  
  local_24 = 0;
  do {
    if (this->n <= local_24) {
      return true;
    }
    for (local_28 = 0; local_28 < this->m; local_28 = local_28 + 1) {
      if (this->M[local_24][local_28] == op2->M[local_24][local_28]) {
        return false;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool operator!=(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (M[i][j] == op2.M[i][j]) {
          return false;
        }
      }
    }
    return true;
  }